

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlFreeNode(xmlNodePtr cur)

{
  xmlElementType xVar1;
  _xmlAttr *p_Var2;
  xmlChar *str;
  xmlAttrPtr cur_00;
  int iVar3;
  xmlDeregisterNodeFunc *pp_Var4;
  _xmlNode *p_Var5;
  _xmlDict *dict;
  
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  xVar1 = cur->type;
  if ((int)xVar1 < 0x11) {
    if (xVar1 == XML_ATTRIBUTE_NODE) {
      xmlFreeProp((xmlAttrPtr)cur);
      return;
    }
    if (xVar1 == XML_DTD_NODE) {
      xmlFreeDtd((xmlDtdPtr)cur);
      return;
    }
LAB_0014bd0d:
    if ((xmlRegisterCallbacks != 0) &&
       (pp_Var4 = __xmlDeregisterNodeDefaultValue(), *pp_Var4 != (xmlDeregisterNodeFunc)0x0)) {
      pp_Var4 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var4)(cur);
    }
    if (cur->doc == (_xmlDoc *)0x0) {
      dict = (xmlDictPtr)0x0;
    }
    else {
      dict = cur->doc->dict;
    }
    if ((cur->children != (xmlNodePtr)0x0) && (cur->type != XML_ENTITY_REF_NODE)) {
      xmlFreeNodeList(cur->children);
    }
    xVar1 = cur->type;
    if ((xVar1 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
       ((0x180002U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
      cur_00 = cur->properties;
      while (cur_00 != (xmlAttrPtr)0x0) {
        p_Var2 = cur_00->next;
        xmlFreeProp(cur_00);
        cur_00 = p_Var2;
      }
      if (cur->nsDef != (xmlNsPtr)0x0) {
        xmlFreeNsList(cur->nsDef);
      }
    }
    else {
      str = cur->content;
      if (((_xmlAttr **)str != &cur->properties &&
           (xVar1 != XML_ENTITY_REF_NODE && str != (xmlChar *)0x0)) &&
         ((dict == (xmlDictPtr)0x0 || (iVar3 = xmlDictOwns(dict,str), iVar3 == 0)))) {
        (*xmlFree)(cur->content);
      }
    }
    if ((((cur->name == (xmlChar *)0x0) || (cur->type == XML_TEXT_NODE)) ||
        (cur->type == XML_COMMENT_NODE)) ||
       ((dict != (xmlDictPtr)0x0 && (iVar3 = xmlDictOwns(dict,cur->name), iVar3 != 0))))
    goto LAB_0014be0f;
    p_Var5 = (_xmlNode *)cur->name;
  }
  else {
    if (xVar1 == XML_ENTITY_DECL) {
      xmlFreeEntity((xmlEntityPtr)cur);
      return;
    }
    if (xVar1 != XML_NAMESPACE_DECL) goto LAB_0014bd0d;
    if (cur->name != (xmlChar *)0x0) {
      (*xmlFree)(cur->name);
    }
    p_Var5 = cur->children;
    if (p_Var5 == (_xmlNode *)0x0) goto LAB_0014be0f;
  }
  (*xmlFree)(p_Var5);
LAB_0014be0f:
  (*xmlFree)(cur);
  return;
}

Assistant:

void
xmlFreeNode(xmlNodePtr cur) {
    xmlDictPtr dict = NULL;

    if (cur == NULL) return;

    /* use xmlFreeDtd for DTD nodes */
    if (cur->type == XML_DTD_NODE) {
	xmlFreeDtd((xmlDtdPtr) cur);
	return;
    }
    if (cur->type == XML_NAMESPACE_DECL) {
	xmlFreeNs((xmlNsPtr) cur);
        return;
    }
    if (cur->type == XML_ATTRIBUTE_NODE) {
	xmlFreeProp((xmlAttrPtr) cur);
	return;
    }
    if (cur->type == XML_ENTITY_DECL) {
        xmlFreeEntity((xmlEntityPtr) cur);
        return;
    }

    if ((xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue(cur);

    if (cur->doc != NULL) dict = cur->doc->dict;

    if ((cur->children != NULL) &&
	(cur->type != XML_ENTITY_REF_NODE))
	xmlFreeNodeList(cur->children);

    if ((cur->type == XML_ELEMENT_NODE) ||
        (cur->type == XML_XINCLUDE_START) ||
        (cur->type == XML_XINCLUDE_END)) {
        if (cur->properties != NULL)
            xmlFreePropList(cur->properties);
        if (cur->nsDef != NULL)
            xmlFreeNsList(cur->nsDef);
    } else if ((cur->content != NULL) &&
               (cur->type != XML_ENTITY_REF_NODE) &&
               (cur->content != (xmlChar *) &(cur->properties))) {
        DICT_FREE(cur->content)
    }

    /*
     * When a node is a text node or a comment, it uses a global static
     * variable for the name of the node.
     * Otherwise the node name might come from the document's dictionary
     */
    if ((cur->name != NULL) &&
        (cur->type != XML_TEXT_NODE) &&
        (cur->type != XML_COMMENT_NODE))
	DICT_FREE(cur->name)

    xmlFree(cur);
}